

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O0

void __thiscall Glucose::SimpSolver::~SimpSolver(SimpSolver *this)

{
  Solver *in_RDI;
  
  ((vec<Glucose::vec<unsigned_int>_> *)&in_RDI->super_Clone)->data =
       (vec<unsigned_int> *)&PTR_clone_00131d18;
  vec<char>::~vec((vec<char> *)0x12268d);
  vec<char>::~vec((vec<char> *)0x12269e);
  Queue<unsigned_int>::~Queue((Queue<unsigned_int> *)0x1226af);
  Heap<Glucose::SimpSolver::ElimLt>::~Heap((Heap<Glucose::SimpSolver::ElimLt> *)in_RDI);
  vec<int>::~vec((vec<int> *)0x1226d1);
  OccLists<int,_Glucose::vec<unsigned_int>,_Glucose::SimpSolver::ClauseDeleted>::~OccLists
            ((OccLists<int,_Glucose::vec<unsigned_int>,_Glucose::SimpSolver::ClauseDeleted> *)in_RDI
            );
  vec<char>::~vec((vec<char> *)0x1226f3);
  vec<unsigned_int>::~vec((vec<unsigned_int> *)0x122704);
  Solver::~Solver(in_RDI);
  return;
}

Assistant:

SimpSolver::~SimpSolver()
{
}